

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBars<short>
               (char *label_id,short *xs,short *ys,short *neg,short *pos,int count,int offset,
               int stride)

{
  undefined1 local_68 [8];
  GetterError<short> getter;
  int count_local;
  short *pos_local;
  short *neg_local;
  short *ys_local;
  short *xs_local;
  char *label_id_local;
  
  getter._44_4_ = count;
  GetterError<short>::GetterError((GetterError<short> *)local_68,xs,ys,neg,pos,count,offset,stride);
  PlotErrorBarsEx<ImPlot::GetterError<short>>(label_id,(GetterError<short> *)local_68);
  return;
}

Assistant:

void PlotErrorBars(const char* label_id, const T* xs, const T* ys, const T* neg, const T* pos, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, neg, pos, count, offset, stride);
    PlotErrorBarsEx(label_id, getter);
}